

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O1

UBool icu_63::compareRules(UVector *rules1,UVector *rules2)

{
  int iVar1;
  int iVar2;
  char cVar3;
  long *plVar4;
  void *pvVar5;
  int index;
  bool bVar6;
  
  bVar6 = true;
  if (rules1 != (UVector *)0x0 || rules2 != (UVector *)0x0) {
    if ((rules1 == (UVector *)0x0 || rules2 == (UVector *)0x0) ||
       (iVar1 = rules1->count, iVar1 != rules2->count)) {
      bVar6 = false;
    }
    else {
      bVar6 = iVar1 < 1;
      if (0 < iVar1) {
        plVar4 = (long *)UVector::elementAt(rules1,0);
        pvVar5 = UVector::elementAt(rules2,0);
        cVar3 = (**(code **)(*plVar4 + 0x28))(plVar4,pvVar5);
        if (cVar3 == '\0') {
          iVar2 = 1;
          do {
            index = iVar2;
            if (iVar1 == index) break;
            plVar4 = (long *)UVector::elementAt(rules1,index);
            pvVar5 = UVector::elementAt(rules2,index);
            cVar3 = (**(code **)(*plVar4 + 0x28))(plVar4,pvVar5);
            iVar2 = index + 1;
          } while (cVar3 == '\0');
          bVar6 = iVar1 <= index;
        }
      }
    }
  }
  return bVar6;
}

Assistant:

static UBool compareRules(UVector* rules1, UVector* rules2) {
    if (rules1 == NULL && rules2 == NULL) {
        return TRUE;
    } else if (rules1 == NULL || rules2 == NULL) {
        return FALSE;
    }
    int32_t size = rules1->size();
    if (size != rules2->size()) {
        return FALSE;
    }
    for (int32_t i = 0; i < size; i++) {
        TimeZoneRule *r1 = (TimeZoneRule*)rules1->elementAt(i);
        TimeZoneRule *r2 = (TimeZoneRule*)rules2->elementAt(i);
        if (*r1 != *r2) {
            return FALSE;
        }
    }
    return TRUE;
}